

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddConvexPolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  ImVec2 IVar1;
  ImDrawVert *pIVar2;
  long lVar3;
  long lVar4;
  ImDrawIdx IVar5;
  ulong uVar6;
  ImDrawIdx *pIVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ImDrawIdx IVar12;
  uint uVar13;
  ImDrawIdx IVar14;
  bool bVar15;
  float fVar16;
  float fVar19;
  ImVec2 IVar17;
  ImVec2 IVar18;
  float fVar20;
  float fVar21;
  undefined1 local_48 [20];
  uint local_34;
  
  if (2 < points_count) {
    IVar1 = this->_Data->TexUvWhitePixel;
    if ((this->Flags & 4) == 0) {
      PrimReserve(this,points_count * 3 + -6,points_count);
      for (uVar6 = 0; (uint)points_count != uVar6; uVar6 = uVar6 + 1) {
        this->_VtxWritePtr->pos = points[uVar6];
        this->_VtxWritePtr->uv = IVar1;
        pIVar2 = this->_VtxWritePtr;
        pIVar2->col = col;
        this->_VtxWritePtr = pIVar2 + 1;
      }
      uVar13 = this->_VtxCurrentIdx;
      pIVar7 = this->_IdxWritePtr;
      iVar8 = points_count + -2;
      iVar9 = uVar13 + 2;
      while (bVar15 = iVar8 != 0, iVar8 = iVar8 + -1, bVar15) {
        *pIVar7 = (ImDrawIdx)uVar13;
        pIVar7[1] = (ImDrawIdx)iVar9 - 1;
        pIVar7[2] = (ImDrawIdx)iVar9;
        pIVar7 = pIVar7 + 3;
        this->_IdxWritePtr = pIVar7;
        iVar9 = iVar9 + 1;
      }
      this->_VtxCurrentIdx = uVar13 + (points_count & 0xffffU);
    }
    else {
      local_48._0_16_ = ZEXT416((uint)this->_FringeScale);
      local_34 = points_count * 2;
      PrimReserve(this,points_count * 9 + -6,local_34);
      uVar13 = this->_VtxCurrentIdx;
      pIVar7 = this->_IdxWritePtr;
      iVar9 = points_count + -2;
      iVar8 = uVar13 + 2;
      while( true ) {
        bVar15 = iVar9 == 0;
        iVar9 = iVar9 + -1;
        IVar5 = (ImDrawIdx)uVar13;
        if (bVar15) break;
        *pIVar7 = IVar5;
        pIVar7[1] = (ImDrawIdx)iVar8;
        iVar8 = iVar8 + 2;
        pIVar7[2] = (ImDrawIdx)iVar8;
        pIVar7 = pIVar7 + 3;
        this->_IdxWritePtr = pIVar7;
      }
      uVar6 = (ulong)(uint)points_count;
      lVar3 = -(uVar6 * 8 + 0xf & 0xfffffffffffffff0);
      lVar4 = lVar3 + -0x48;
      iVar8 = points_count + -1;
      iVar9 = iVar8;
      for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
        lVar11 = (long)iVar9;
        fVar16 = points[uVar10].x - points[lVar11].x;
        fVar19 = points[uVar10].y - points[lVar11].y;
        fVar20 = fVar16 * fVar16 + fVar19 * fVar19;
        if (0.0 < fVar20) {
          fVar20 = 1.0 / SQRT(fVar20);
          fVar16 = fVar16 * fVar20;
          fVar19 = fVar19 * fVar20;
        }
        *(float *)(local_48 + lVar11 * 8 + lVar4 + 0x48) = fVar19;
        *(float *)(local_48 + lVar11 * 8 + lVar3 + 4) = -fVar16;
        iVar9 = (int)uVar10;
      }
      for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
        pIVar2 = this->_VtxWritePtr;
        fVar19 = ((float)*(undefined8 *)(local_48 + uVar10 * 8 + lVar4 + 0x48) +
                 (float)*(undefined8 *)(local_48 + (long)iVar8 * 8 + lVar4 + 0x48)) * 0.5;
        fVar20 = ((float)((ulong)*(undefined8 *)(local_48 + uVar10 * 8 + lVar4 + 0x48) >> 0x20) +
                 (float)((ulong)*(undefined8 *)(local_48 + (long)iVar8 * 8 + lVar4 + 0x48) >> 0x20))
                 * 0.5;
        fVar21 = fVar19 * fVar19 + fVar20 * fVar20;
        fVar16 = 0.5;
        if (0.5 <= fVar21) {
          fVar16 = fVar21;
        }
        fVar19 = (1.0 / fVar16) * fVar19 * (float)local_48._0_4_ * 0.5;
        fVar16 = (1.0 / fVar16) * fVar20 * (float)local_48._0_4_ * 0.5;
        IVar17.x = points[uVar10].x - fVar19;
        IVar17.y = points[uVar10].y - fVar16;
        pIVar2->pos = IVar17;
        pIVar2->uv = IVar1;
        pIVar2 = this->_VtxWritePtr;
        pIVar2->col = col;
        IVar18.x = points[uVar10].x + fVar19;
        IVar18.y = points[uVar10].y + fVar16;
        pIVar2[1].pos = IVar18;
        pIVar2[1].uv = IVar1;
        pIVar2 = this->_VtxWritePtr;
        pIVar2[1].col = col & 0xffffff;
        this->_VtxWritePtr = pIVar2 + 2;
        pIVar7 = this->_IdxWritePtr;
        IVar12 = (ImDrawIdx)uVar13;
        *pIVar7 = IVar12;
        pIVar7[1] = IVar5 + (short)iVar8 * 2;
        IVar14 = IVar5 + 1 + (short)iVar8 * 2;
        pIVar7[2] = IVar14;
        pIVar7[3] = IVar14;
        pIVar7[4] = IVar12 + 1;
        pIVar7[5] = IVar12;
        this->_IdxWritePtr = pIVar7 + 6;
        iVar8 = (int)uVar10;
        uVar13 = uVar13 + 2;
      }
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + (local_34 & 0xfffe);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count - 2)*3 + points_count * 6;
        const int vtx_count = (points_count * 2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx + 1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + ((i - 1) << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx + (i << 1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * sizeof(ImVec2)); //-V630
        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_FIXNORMAL2F(dm_x, dm_y);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + (i0 << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx + (i1 << 1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count - 2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + i - 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}